

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O2

int * __thiscall amrex::BaseFab<int>::dataPtr(BaseFab<int> *this,int n)

{
  Long LVar1;
  int *piVar2;
  
  piVar2 = this->dptr;
  if (piVar2 == (int *)0x0) {
    piVar2 = (int *)0x0;
  }
  else {
    LVar1 = Box::numPts(&this->domain);
    piVar2 = piVar2 + LVar1 * n;
  }
  return piVar2;
}

Assistant:

T* dataPtr (int n = 0) noexcept {
        if (this->dptr) {
            return &(this->dptr[n*this->domain.numPts()]);
        } else {
            return nullptr;
        }
    }